

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  initializer_list<double> il;
  initializer_list<double> il_00;
  bool bVar2;
  int iVar3;
  result_type rVar4;
  const_reference pdVar5;
  reference pdVar6;
  void *pvVar7;
  reference pvVar8;
  back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
  out;
  iterator iVar9;
  iterator iVar10;
  reference ppVar11;
  ostream *poVar12;
  rectangle<perior::point<double,_2UL>_> *rect;
  double dVar13;
  pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> *i_11;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *__range1;
  type local_1cb8;
  undefined1 local_1c98 [8];
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  vals;
  aabb_t q;
  string local_1c58 [32];
  __cxx11 local_1c38 [39];
  allocator local_1c11;
  string local_1c10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bf0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bd0 [8];
  string fname_2;
  pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> local_1bb0;
  double local_1b88;
  array<double,_2UL> local_1b80;
  array<double,_2UL> local_1b70;
  double local_1b60;
  array<double,_2UL> local_1b58;
  array<double,_2UL> local_1b48;
  double local_1b38;
  double local_1b30;
  undefined1 local_1b28 [8];
  point_t u_1;
  unsigned_long local_1b10;
  undefined1 local_1b08 [8];
  point_t l_1;
  size_t yidx_1;
  size_t xidx_1;
  size_t spidx_1;
  aabb_t box_1;
  size_t i_6;
  string local_1ab0 [32];
  __cxx11 local_1a90 [39];
  allocator local_1a69;
  string local_1a68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a28 [8];
  string fname_1;
  pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> local_1a08;
  size_type local_19e0;
  size_t idx;
  size_t i_5;
  string local_19c8 [32];
  __cxx11 local_19a8 [39];
  allocator local_1981;
  string local_1980 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1960 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1940 [8];
  string fname;
  pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> local_1920;
  double local_18f8;
  array<double,_2UL> local_18f0;
  array<double,_2UL> local_18e0;
  double local_18d0;
  array<double,_2UL> local_18c8;
  array<double,_2UL> local_18b8;
  double local_18a8;
  double local_18a0;
  undefined1 local_1898 [8];
  point_t u;
  unsigned_long local_1880;
  undefined1 local_1878 [8];
  point_t l;
  size_t yidx;
  size_t xidx;
  size_t spidx;
  aabb_t box;
  size_t i;
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  boxes;
  uniform_int_distribution<unsigned_long> uni;
  mt19937 mt_;
  undefined1 local_468 [8];
  rtree_t tree;
  point<double,_2UL> local_310;
  double local_300 [2];
  iterator local_2f0;
  undefined8 local_2e8;
  point<double,_2UL> local_2e0;
  undefined1 local_2d0 [8];
  boundary_t bdry;
  ulong local_248;
  size_t i_10;
  point<double,_2UL> *retval_7;
  ulong local_218;
  size_t i_8;
  point<double,_2UL> *retval_5;
  ulong local_1e8;
  size_t i_4;
  point<double,_2UL> *retval_3;
  ulong local_1b8;
  size_t i_2;
  point<double,_2UL> *retval_1;
  ulong local_188;
  size_t i_7;
  point<double,_2UL> *retval_4;
  ulong local_148;
  size_t i_1;
  point<double,_2UL> *retval;
  ulong local_108;
  size_t i_9;
  point<double,_2UL> *retval_6;
  ulong local_c8;
  size_t i_3;
  point<double,_2UL> *retval_2;
  
  bdry.half_width_.values_.elems[1]._4_4_ = 0;
  local_300[0] = 0.0;
  local_300[1] = 0.0;
  local_2f0 = local_300;
  local_2e8 = 2;
  il_00._M_len = 2;
  il_00._M_array = local_2f0;
  perior::point<double,_2UL>::point(&local_2e0,il_00);
  tree._304_8_ = 0x408f400000000000;
  il._M_len = 2;
  il._M_array = (iterator)&tree.field_0x130;
  perior::point<double,_2UL>::point(&local_310,il);
  perior::cubic_periodic_boundary<perior::point<double,_2UL>_>::cubic_periodic_boundary
            ((cubic_periodic_boundary<perior::point<double,_2UL>_> *)local_2d0,&local_2e0,&local_310
            );
  perior::
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *)local_468,(cubic_periodic_boundary<perior::point<double,_2UL>_> *)local_2d0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&uni._M_param._M_b,0x75bcd15);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)
             &boxes.
              super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,10000);
  std::
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ::vector((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
            *)&i);
  for (box.radius.values_.elems[1] = 0.0; (ulong)box.radius.values_.elems[1] < 0x32;
      box.radius.values_.elems[1] = (double)((long)box.radius.values_.elems[1] + 1)) {
    perior::rectangle<perior::point<double,_2UL>_>::rectangle
              ((rectangle<perior::point<double,_2UL>_> *)&spidx);
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &boxes.
                        super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&uni._M_param._M_b);
    l.values_.elems[1] = (double)((rVar4 - rVar4 % 100) / 100);
    local_1880 = (rVar4 % 100) * 10;
    u.values_.elems[1] = (double)((long)l.values_.elems[1] * 10);
    perior::point<double,_2UL>::point<unsigned_long,_unsigned_long,_nullptr>
              ((point<double,_2UL> *)local_1878,&local_1880,(unsigned_long *)(u.values_.elems + 1));
    pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1878,0);
    local_18a0 = *pdVar5 + 10.0;
    pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1878,1);
    local_18a8 = *pdVar5 + 10.0;
    perior::point<double,_2UL>::point<double,_double,_nullptr>
              ((point<double,_2UL> *)local_1898,&local_18a0,&local_18a8);
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_18c8);
    for (local_148 = 0; local_148 < 2; local_148 = local_148 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1898,local_148);
      dVar13 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1878,local_148);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_18c8,local_148);
      *pdVar6 = dVar13 + dVar1;
    }
    local_18d0 = 2.0;
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_18b8);
    for (local_1b8 = 0; local_1b8 < 2; local_1b8 = local_1b8 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_18c8,local_1b8);
      dVar13 = *pdVar5 / local_18d0;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_18b8,local_1b8);
      *pdVar6 = dVar13;
    }
    perior::point<double,_2UL>::operator=
              ((point<double,_2UL> *)&spidx,(point<double,_2UL> *)&local_18b8);
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_18f0);
    for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1898,local_c8);
      dVar13 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1878,local_c8);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_18f0,local_c8);
      *pdVar6 = dVar13 - dVar1;
    }
    local_18f8 = 2.0;
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_18e0);
    for (local_1e8 = 0; local_1e8 < 2; local_1e8 = local_1e8 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_18f0,local_1e8);
      dVar13 = *pdVar5 / local_18f8;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_18e0,local_1e8);
      *pdVar6 = dVar13;
    }
    perior::point<double,_2UL>::operator=
              ((point<double,_2UL> *)(box.center.values_.elems + 1),
               (point<double,_2UL> *)&local_18e0);
    std::
    vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
    ::push_back((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                 *)&i,(value_type *)&spidx);
    std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>::
    pair<perior::rectangle<perior::point<double,_2UL>_>_&,_unsigned_long_&,_true>
              (&local_1920,(rectangle<perior::point<double,_2UL>_> *)&spidx,
               (unsigned_long *)(box.radius.values_.elems + 1));
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_468,&local_1920);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1980,"rtree_",&local_1981);
    std::__cxx11::to_string(local_19a8,(unsigned_long)box.radius.values_.elems[1]);
    std::operator+(local_1960,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1980);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19c8,".svg",(allocator *)((long)&i_5 + 7));
    std::operator+(local_1940,local_1960);
    std::__cxx11::string::~string(local_19c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_5 + 7));
    std::__cxx11::string::~string((string *)local_1960);
    std::__cxx11::string::~string((string *)local_19a8);
    std::__cxx11::string::~string(local_1980);
    std::allocator<char>::~allocator((allocator<char> *)&local_1981);
    dump(local_1940,(rtree_t *)local_468,(boundary_t *)local_2d0);
    std::__cxx11::string::~string((string *)local_1940);
  }
  for (idx = 0x32; idx < 0x46; idx = idx + 1) {
    local_19e0 = idx - 0x32;
    pvVar7 = (void *)std::ostream::operator<<(&std::cout,std::boolalpha);
    pvVar8 = std::
             vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
             ::at((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                   *)&i,local_19e0);
    std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>::
    pair<perior::rectangle<perior::point<double,_2UL>_>_&,_true>(&local_1a08,pvVar8,&local_19e0);
    iVar3 = perior::
            rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            ::remove((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                      *)local_468,(char *)&local_1a08);
    pvVar7 = (void *)std::ostream::operator<<(pvVar7,(bool)((byte)iVar3 & 1));
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a68,"rtree_",&local_1a69);
    std::__cxx11::to_string(local_1a90,idx);
    std::operator+(local_1a48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ab0,".svg",(allocator *)((long)&i_6 + 7));
    std::operator+(local_1a28,local_1a48);
    std::__cxx11::string::~string(local_1ab0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_6 + 7));
    std::__cxx11::string::~string((string *)local_1a48);
    std::__cxx11::string::~string((string *)local_1a90);
    std::__cxx11::string::~string(local_1a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a69);
    dump(local_1a28,(rtree_t *)local_468,(boundary_t *)local_2d0);
    std::__cxx11::string::~string((string *)local_1a28);
  }
  for (box_1.radius.values_.elems[1] = 3.45845952088873e-322;
      (ulong)box_1.radius.values_.elems[1] < 0x5a;
      box_1.radius.values_.elems[1] = (double)((long)box_1.radius.values_.elems[1] + 1)) {
    perior::rectangle<perior::point<double,_2UL>_>::rectangle
              ((rectangle<perior::point<double,_2UL>_> *)&spidx_1);
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &boxes.
                        super__Vector_base<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&uni._M_param._M_b);
    l_1.values_.elems[1] = (double)((rVar4 - rVar4 % 100) / 100);
    local_1b10 = (rVar4 % 100) * 10;
    u_1.values_.elems[1] = (double)((long)l_1.values_.elems[1] * 10);
    perior::point<double,_2UL>::point<unsigned_long,_unsigned_long,_nullptr>
              ((point<double,_2UL> *)local_1b08,&local_1b10,(unsigned_long *)(u_1.values_.elems + 1)
              );
    pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b08,0);
    local_1b30 = *pdVar5 + 10.0;
    pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b08,1);
    local_1b38 = *pdVar5 + 10.0;
    perior::point<double,_2UL>::point<double,_double,_nullptr>
              ((point<double,_2UL> *)local_1b28,&local_1b30,&local_1b38);
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_1b58);
    for (local_188 = 0; local_188 < 2; local_188 = local_188 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b28,local_188);
      dVar13 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b08,local_188);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_1b58,local_188);
      *pdVar6 = dVar13 + dVar1;
    }
    local_1b60 = 2.0;
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_1b48);
    for (local_218 = 0; local_218 < 2; local_218 = local_218 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_1b58,local_218);
      dVar13 = *pdVar5 / local_1b60;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_1b48,local_218);
      *pdVar6 = dVar13;
    }
    perior::point<double,_2UL>::operator=
              ((point<double,_2UL> *)&spidx_1,(point<double,_2UL> *)&local_1b48);
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_1b80);
    for (local_108 = 0; local_108 < 2; local_108 = local_108 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b28,local_108);
      dVar13 = *pdVar5;
      pdVar5 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)local_1b08,local_108);
      dVar1 = *pdVar5;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_1b80,local_108);
      *pdVar6 = dVar13 - dVar1;
    }
    local_1b88 = 2.0;
    perior::point<double,_2UL>::point((point<double,_2UL> *)&local_1b70);
    for (local_248 = 0; local_248 < 2; local_248 = local_248 + 1) {
      pdVar5 = boost::array<double,_2UL>::operator[](&local_1b80,local_248);
      dVar13 = *pdVar5 / local_1b88;
      pdVar6 = boost::array<double,_2UL>::operator[](&local_1b70,local_248);
      *pdVar6 = dVar13;
    }
    perior::point<double,_2UL>::operator=
              ((point<double,_2UL> *)(box_1.center.values_.elems + 1),
               (point<double,_2UL> *)&local_1b70);
    std::
    vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
    ::push_back((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                 *)&i,(value_type *)&spidx_1);
    std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>::
    pair<perior::rectangle<perior::point<double,_2UL>_>_&,_unsigned_long_&,_true>
              (&local_1bb0,(rectangle<perior::point<double,_2UL>_> *)&spidx_1,
               (unsigned_long *)(box_1.radius.values_.elems + 1));
    perior::
    rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
    ::insert((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *)local_468,&local_1bb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c10,"rtree_",&local_1c11);
    std::__cxx11::to_string(local_1c38,(unsigned_long)box_1.radius.values_.elems[1]);
    std::operator+(local_1bf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1c58,".svg",(allocator *)((long)q.radius.values_.elems + 0xf));
    std::operator+(local_1bd0,local_1bf0);
    std::__cxx11::string::~string(local_1c58);
    std::allocator<char>::~allocator((allocator<char> *)((long)q.radius.values_.elems + 0xf));
    std::__cxx11::string::~string((string *)local_1bf0);
    std::__cxx11::string::~string((string *)local_1c38);
    std::__cxx11::string::~string(local_1c10);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c11);
    dump(local_1bd0,(rtree_t *)local_468,(boundary_t *)local_2d0);
    std::__cxx11::string::~string((string *)local_1bd0);
  }
  pvVar8 = std::
           vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
           ::back((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
                   *)&i);
  perior::rectangle<perior::point<double,_2UL>_>::rectangle
            ((rectangle<perior::point<double,_2UL>_> *)
             &vals.
              super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar8);
  std::
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::vector((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *)local_1c98);
  perior::query::intersects_box<perior::point<double,2ul>>
            (&local_1cb8,
             (query *)&vals.
                       super__Vector_base<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,rect);
  out = std::
        back_inserter<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>
                  ((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                    *)local_1c98);
  perior::
  rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
  ::
  query<perior::query::query_intersects_box<perior::point<double,2ul>>,std::back_insert_iterator<std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>>
            ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
              *)local_468,&local_1cb8,out);
  iVar9 = std::
          vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
          ::begin((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                   *)local_1c98);
  iVar10 = std::
           vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           ::end((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                  *)local_1c98);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>*,std::vector<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>>,main::__0>
            (iVar9._M_current,iVar10._M_current);
  std::operator<<((ostream *)&std::cout,"queried values = { ");
  __end1 = std::
           vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           ::begin((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                    *)local_1c98);
  i_11 = (pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long> *)
         std::
         vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
         ::end((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *)local_1c98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_*,_std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
                                *)&i_11);
    if (!bVar2) break;
    ppVar11 = __gnu_cxx::
              __normal_iterator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_*,_std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
              ::operator*(&__end1);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cout,ppVar11->second);
    std::operator<<(poVar12,' ');
    __gnu_cxx::
    __normal_iterator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_*,_std::vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  poVar12 = std::operator<<((ostream *)&std::cout,'}');
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  bdry.half_width_.values_.elems[1]._4_4_ = 0;
  std::
  vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::~vector((vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
             *)local_1c98);
  std::
  vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
  ::~vector((vector<perior::rectangle<perior::point<double,_2UL>_>,_std::allocator<perior::rectangle<perior::point<double,_2UL>_>_>_>
             *)&i);
  perior::
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  ::~rtree((rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *)local_468);
  perior::cubic_periodic_boundary<perior::point<double,_2UL>_>::~cubic_periodic_boundary
            ((cubic_periodic_boundary<perior::point<double,_2UL>_> *)local_2d0);
  return bdry.half_width_.values_.elems[1]._4_4_;
}

Assistant:

int main()
{
    boundary_t bdry(point_t{0,0}, point_t{1000, 1000});
    rtree_t tree(bdry);

    std::mt19937 mt_(123456789);
    std::uniform_int_distribution<std::size_t> uni(0, 10000);

    std::vector<aabb_t> boxes;
    for(std::size_t i=0; i<50; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));

        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);

    }

    for(std::size_t i=50; i<70; ++i)
    {
        const std::size_t idx = i - 50;
        std::cout << std::boolalpha << tree.remove(value_t(boxes.at(idx), idx)) << std::endl;
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    for(std::size_t i=70; i<90; ++i)
    {
        aabb_t box;
        const std::size_t spidx = uni(mt_);
        const std::size_t xidx  =  spidx % 100;
        const std::size_t yidx  = (spidx - xidx) / 100;
        const point_t l(xidx * 10, yidx * 10);
        const point_t u(l[0] + 10, l[1] + 10);

        box.center = (u + l) / 2;
        box.radius = (u - l) / 2;
        boxes.push_back(box);

        tree.insert(value_t(box, i));
        std::string fname = std::string("rtree_") + std::to_string(i) + std::string(".svg");
        dump(fname, tree, bdry);
    }

    aabb_t q(boxes.back());
    std::vector<value_t> vals;
    tree.query(perior::query::intersects_box(q), std::back_inserter(vals));

    std::sort(vals.begin(), vals.end(), [](const value_t& lhs, const value_t rhs){return lhs.second < rhs.second;});

    std::cout << "queried values = { ";
    for(auto const& i : vals)
        std::cout << i.second << ' ';
    std::cout << '}' << std::endl;

    return 0;
}